

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O0

int divsufsortxx::substring::compare_last<char*,bitmap::BitmapArray<long>::iterator>
              (char *T,iterator p1,iterator p2,value_type depth,value_type size)

{
  iterator *this;
  long lVar1;
  char *pcVar2;
  long in_RDI;
  long in_R9;
  bool bVar3;
  long in_stack_00000008;
  char *U2n;
  char *U1n;
  char *U2;
  char *U1;
  int local_b4;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  char *local_50;
  char *local_38;
  
  this = (iterator *)(in_RDI + in_R9);
  bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x117a61);
  lVar1 = bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x117a75);
  local_38 = (char *)((long)&this->array_ + lVar1);
  bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x117aaa);
  lVar1 = bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x117abe);
  local_50 = (char *)(in_RDI + in_R9 + lVar1);
  bitmap::BitmapArray<long>::iterator::operator+
            (this,CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x117b16);
  lVar1 = bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x117b2a);
  pcVar2 = (char *)(in_RDI + lVar1 + 2);
  while( true ) {
    bVar3 = false;
    if ((local_38 < (char *)(in_RDI + in_stack_00000008)) && (bVar3 = false, local_50 < pcVar2)) {
      bVar3 = *local_38 == *local_50;
    }
    if (!bVar3) break;
    local_38 = local_38 + 1;
    local_50 = local_50 + 1;
  }
  if (local_38 < (char *)(in_RDI + in_stack_00000008)) {
    if (local_50 < pcVar2) {
      local_b4 = (uint)(*local_50 < *local_38) * 2 + -1;
    }
    else {
      local_b4 = 1;
    }
  }
  else {
    local_b4 = 0;
    if (local_50 < pcVar2) {
      local_b4 = -1;
    }
  }
  return local_b4;
}

Assistant:

int compare_last(
    StringIterator_type T, const SAIterator_type p1, const SAIterator_type p2,
    typename std::iterator_traits<SAIterator_type>::value_type depth,
    typename std::iterator_traits<SAIterator_type>::value_type size) {
  StringIterator_type U1 = T + depth + *p1, U2 = T + depth + *p2, U1n = T
      + size, U2n = T + *(p2 + 1) + 2;
  for (; (U1 < U1n) && (U2 < U2n) && (*U1 == *U2); ++U1, ++U2) {
  }

  return U1 < U1n ? (U2 < U2n ? (*U2 < *U1) * 2 - 1 : 1) :
//        (U2 < U2n ? *U1 - *U2 : 1) :
      (U2 < U2n ? -1 : 0);
}